

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O3

int pfx_table_copy_except_socket(pfx_table *src_table,pfx_table *dst_table,rtr_socket *socket)

{
  int iVar1;
  long in_FS_OFFSET;
  copy_cb_args args;
  pfx_table *local_30;
  rtr_socket *local_28;
  byte local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  local_30 = dst_table;
  local_28 = socket;
  pfx_table_for_each_ipv4_record(src_table,pfx_table_copy_cb,&local_30);
  iVar1 = -1;
  if (local_20 == 0) {
    pfx_table_for_each_ipv6_record(src_table,pfx_table_copy_cb,&local_30);
    iVar1 = -(uint)local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_copy_except_socket(struct pfx_table *src_table, struct pfx_table *dst_table,
				 const struct rtr_socket *socket)
{
	struct copy_cb_args args = {dst_table, socket, false};

	pfx_table_for_each_ipv4_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	pfx_table_for_each_ipv6_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	return PFX_SUCCESS;
}